

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void Js::JavascriptOperators::CallSetter
               (RecyclableObject *function,Var object,Var value,ScriptContext *requestContext)

{
  bool bVar1;
  ThreadContext *this;
  bool bVar2;
  Attributes attributes;
  ImplicitCallFlags IVar3;
  anon_class_48_6_c5160bac local_58;
  
  local_58.scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  this = (local_58.scriptContext)->threadContext;
  bVar1 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  local_58.object = object;
  local_58.function = function;
  local_58.requestContext = requestContext;
  local_58.value = value;
  local_58.threadContext = this;
  attributes = FunctionInfo::GetAttributes(function);
  bVar2 = ThreadContext::HasNoSideEffect(this,function,attributes);
  if (bVar2) {
    CallSetter::anon_class_48_6_c5160bac::operator()(&local_58);
    bVar2 = ThreadContext::IsOnStack((void *)0x0);
LAB_0099a733:
    if (bVar2 == false) goto LAB_0099a776;
LAB_0099a761:
    IVar3 = this->implicitCallFlags;
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag)
    goto LAB_0099a761;
    if ((attributes & HasNoSideEffect) != None) {
      CallSetter::anon_class_48_6_c5160bac::operator()(&local_58);
      bVar2 = ThreadContext::IsOnStack((void *)0x0);
      goto LAB_0099a733;
    }
    IVar3 = this->implicitCallFlags;
    CallSetter::anon_class_48_6_c5160bac::operator()(&local_58);
  }
  this->implicitCallFlags = IVar3 | ImplicitCall_Accessor;
LAB_0099a776:
  this->reentrancySafeOrHandled = bVar1;
  return;
}

Assistant:

void JavascriptOperators::CallSetter(RecyclableObject * const function, Var const  object, Var const value, ScriptContext * requestContext)
    {
        ScriptContext * scriptContext = function->GetScriptContext();
        ThreadContext * threadContext = scriptContext->GetThreadContext();
        threadContext->ExecuteImplicitCall(function, ImplicitCall_Accessor, [=]() -> Js::Var
        {
            // Stack object should have a pre-op bail on implicit call.  We shouldn't see them here.
            // Stack numbers are ok, as we will call ToObject to wrap it in a number object anyway
            // See JavascriptOperators::GetThisHelper
            Assert(JavascriptOperators::GetTypeId(object) == TypeIds_Integer ||
                JavascriptOperators::GetTypeId(object) == TypeIds_Number || !ThreadContext::IsOnStack(object));

            // Verify that the scriptcontext is alive before firing getter/setter
            if (!scriptContext->VerifyAlive(!function->IsExternal(), requestContext))
            {
                return nullptr;
            }

            CallFlags flags = CallFlags_Value;
            Var putValue = value;

            // CONSIDER: Have requestContext everywhere, even in the setProperty related codepath.
            if (requestContext)
            {
                putValue = CrossSite::MarshalVar(requestContext, value);
            }

            Var thisVar = RootToThisObject(object, scriptContext);

            RecyclableObject* marshalledFunction = function;
            if (requestContext)
            {
                marshalledFunction = UnsafeVarTo<RecyclableObject>(CrossSite::MarshalVar(requestContext, function, function->GetScriptContext()));
            }

            Var result = CALL_ENTRYPOINT(threadContext, marshalledFunction->GetEntryPoint(), function, CallInfo(flags, 2), thisVar, putValue);
            Assert(result);

            // Set implicit call flags so we bail out if we're trying to propagate the stored value forward. We can't count on the getter/setter
            // to produce the stored value on a LdFld.
            threadContext->AddImplicitCallFlags(ImplicitCall_Accessor);

            return nullptr;
        });
    }